

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O2

void streamout(stringstream *oss,char *s,int length)

{
  if (length != 0) {
    std::ostream::write((char *)(oss + 0x10),(long)s);
    return;
  }
  std::operator<<((ostream *)(oss + 0x10),s);
  return;
}

Assistant:

void
streamout(stringstream& oss, const char* s, int length)
{
    // Can't find a way to get stringstream to truncate a stream.
    if (length != 0)
        oss.write(s, length);
    else
        oss << s;
}